

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

LoopEvent rec_for(jit_State *J,BCIns *fori,int isforl)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  IRRef1 IVar5;
  uint uVar6;
  TRef TVar7;
  IRType t;
  BCIns *pBVar8;
  ushort uVar9;
  long lVar10;
  uint *puVar11;
  LoopEvent LVar12;
  TValue *o;
  double dVar13;
  ScEvEntry scev;
  uint local_5c;
  ScEvEntry local_48;
  
  bVar3 = *(byte *)((long)fori + 1);
  o = (TValue *)((ulong)((uint)bVar3 * 8) + (long)J->L->base);
  puVar11 = (uint *)((ulong)((uint)bVar3 * 4) + (long)J->base);
  if (isforl == 0) {
    lj_meta_for(J->L,o);
    t = IRT_NUM;
    if ((*puVar11 & 0x1f000000) == 0x13000000) {
      t = lj_opt_narrow_forl(J,o);
    }
    lVar10 = 0;
    do {
      if (puVar11[lVar10] == 0) {
        sload(J,(uint)bVar3 + (int)lVar10);
      }
      if ((puVar11[lVar10] & 0x1f000000) == 0x4000000) {
        (J->fold).ins.field_0.op1 = (IRRef1)puVar11[lVar10];
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5e8e0000;
        TVar7 = lj_opt_fold(J);
        puVar11[lVar10] = TVar7;
      }
      uVar6 = puVar11[lVar10];
      if (t == IRT_INT) {
        if (4 < (uVar6 >> 0x18 & 0x1f) - 0xf) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b93326e;
LAB_001521ec:
          TVar7 = lj_opt_fold(J);
          puVar11[lVar10] = TVar7;
        }
      }
      else if ((uVar6 & 0x1f000000) != 0xe000000) {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
        goto LAB_001521ec;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_5c = puVar11[1];
    puVar11[3] = *puVar11;
    rec_for_check(J,t,~*(uint *)((long)o + 0x14) >> 0x1f,local_5c,puVar11[2],1);
  }
  else {
    if (((BCIns *)(J->scev).pc.ptr64 == fori) && (uVar6 = *puVar11, (J->scev).idx == (IRRef1)uVar6))
    {
      bVar4 = (J->scev).t.irt;
      uVar9 = (J->scev).stop;
      IVar5 = (J->scev).step;
      (J->fold).ins.field_0.ot = bVar4 | 0x2900;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
      (J->fold).ins.field_0.op2 = IVar5;
      TVar7 = lj_opt_fold(J);
      *puVar11 = TVar7;
      puVar11[3] = TVar7;
      local_48.t.irt = bVar4;
      local_48.stop = uVar9;
    }
    else {
      rec_for_loop(J,fori,&local_48,0);
    }
    local_5c = (uint)local_48.stop;
    t = (IRType)local_48.t.irt;
  }
  dVar13 = o->n;
  dVar1 = o[2].n;
  if (isforl != 0) {
    dVar13 = dVar13 + dVar1;
  }
  dVar2 = o[1].n;
  if (*(int *)((long)o + 0x14) < 0) {
    uVar9 = 0;
    LVar12 = LOOPEV_LEAVE;
    if (dVar2 <= dVar13) {
      LVar12 = (dVar2 <= dVar1 + dVar1 + dVar13) + LOOPEV_ENTERLO;
      uVar9 = 0x100;
    }
  }
  else if (dVar13 <= dVar2) {
    LVar12 = (dVar1 + dVar1 + dVar13 <= dVar2) + LOOPEV_ENTERLO;
    uVar9 = 0x200;
  }
  else {
    LVar12 = LOOPEV_LEAVE;
    uVar9 = 0x300;
  }
  if (LVar12 == LOOPEV_LEAVE) {
    J->maxslot = bVar3 + 4;
    pBVar8 = fori + 1;
  }
  else {
    J->maxslot = (uint)bVar3;
    pBVar8 = fori + ((ulong)*(ushort *)((long)fori + 2) - 0x7fff);
  }
  J->pc = pBVar8;
  lj_snap_add(J);
  uVar6 = *puVar11;
  (J->fold).ins.field_0.ot = (ushort)t | uVar9 | 0x80;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
  (J->fold).ins.field_0.op2 = (IRRef1)local_5c;
  lj_opt_fold(J);
  if (LVar12 == LOOPEV_LEAVE) {
    J->maxslot = (uint)bVar3;
    pBVar8 = fori + ((ulong)*(ushort *)((long)fori + 2) - 0x7fff);
  }
  else {
    J->maxslot = bVar3 + 4;
    pBVar8 = fori + 1;
  }
  J->pc = pBVar8;
  J->needsnap = '\x01';
  return LVar12;
}

Assistant:

static LoopEvent rec_for(jit_State *J, const BCIns *fori, int isforl)
{
  BCReg ra = bc_a(*fori);
  TValue *tv = &J->L->base[ra];
  TRef *tr = &J->base[ra];
  IROp op;
  LoopEvent ev;
  TRef stop;
  IRType t;
  if (isforl) {  /* Handle FORL/JFORL opcodes. */
    TRef idx = tr[FORL_IDX];
    if (mref(J->scev.pc, const BCIns) == fori && tref_ref(idx) == J->scev.idx) {
      t = J->scev.t.irt;
      stop = J->scev.stop;
      idx = emitir(IRT(IR_ADD, t), idx, J->scev.step);
      tr[FORL_EXT] = tr[FORL_IDX] = idx;
    } else {
      ScEvEntry scev;
      rec_for_loop(J, fori, &scev, 0);
      t = scev.t.irt;
      stop = scev.stop;
    }
  } else {  /* Handle FORI/JFORI opcodes. */
    BCReg i;
    lj_meta_for(J->L, tv);
    t = (LJ_DUALNUM || tref_isint(tr[FORL_IDX])) ? lj_opt_narrow_forl(J, tv) :
						   IRT_NUM;
    for (i = FORL_IDX; i <= FORL_STEP; i++) {
      if (!tr[i]) sload(J, ra+i);
      lj_assertJ(tref_isnumber_str(tr[i]), "bad FORI argument type");
      if (tref_isstr(tr[i]))
	tr[i] = emitir(IRTG(IR_STRTO, IRT_NUM), tr[i], 0);
      if (t == IRT_INT) {
	if (!tref_isinteger(tr[i]))
	  tr[i] = emitir(IRTGI(IR_CONV), tr[i], IRCONV_INT_NUM|IRCONV_CHECK);
      } else {
	if (!tref_isnum(tr[i]))
	  tr[i] = emitir(IRTN(IR_CONV), tr[i], IRCONV_NUM_INT);
      }
    }
    tr[FORL_EXT] = tr[FORL_IDX];
    stop = tr[FORL_STOP];
    rec_for_check(J, t, rec_for_direction(&tv[FORL_STEP]),
		  stop, tr[FORL_STEP], 1);
  }

  ev = rec_for_iter(&op, tv, isforl);
  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  } else {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  }
  lj_snap_add(J);

  emitir(IRTG(op, t), tr[FORL_IDX], stop);

  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  } else {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  }
  J->needsnap = 1;
  return ev;
}